

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O0

return_type
boost::asio::
async_result<ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,void()>
::
initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&>
          (initiate_post *op,
          yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *token)

{
  promise<> *this;
  anon_class_16_2_08e66f54 local_58;
  undefined1 local_48 [8];
  completion_handler_type handler;
  fiber_context *ctx;
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *pyStack_18;
  promise<> promise;
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *token_local;
  initiate_post *op_local;
  
  this = (promise<> *)((long)&ctx + 4);
  pyStack_18 = token;
  ufiber::detail::promise<>::promise(this);
  handler.executor_._8_8_ =
       ufiber::detail::
       get_fiber<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(pyStack_18);
  ufiber::detail::
  completion_handler<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::
  completion_handler((completion_handler<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                      *)local_48,this,pyStack_18,(fiber_context *)handler.executor_._8_8_);
  local_58.op = op;
  local_58.handler =
       (completion_handler<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
        *)local_48;
  ufiber::detail::fiber_context::
  suspend_with<boost::asio::async_result<ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,void()>::initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&>(boost::asio::detail::initiate_post&&,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&)::_lambda()_1_>
            ((fiber_context *)handler.executor_._8_8_,&local_58);
  ufiber::detail::promise<>::get_value(this);
  ufiber::detail::
  completion_handler<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::
  ~completion_handler((completion_handler<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                       *)local_48);
  return;
}

Assistant:

static return_type initiate(Op&& op, Token&& token, Ts&&... ts)
    {
        ::ufiber::detail::promise<Args...> promise;
        ::ufiber::detail::fiber_context& ctx =
          ::ufiber::detail::get_fiber(token);
        completion_handler_type handler{&promise, token, ctx};
        ctx.suspend_with([&]() noexcept {
            op(std::move(handler), std::forward<Ts>(ts)...);
        });
        return promise.get_value();
    }